

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
           *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>::int_writer<int,_fmt::v5::basic_format_specs<char>_>::bin_writer<3>_>
          *f)

{
  __type _Var1;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> __first;
  unsigned_long __n;
  char_type fill;
  char local_29;
  
  __n = (ulong)spec->width_ - f->size_;
  if ((ulong)spec->width_ < f->size_ || __n == 0) {
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
                  *)f,(back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *)this
                );
    return;
  }
  local_29 = (char)spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    _Var1 = std::
            __fill_n_a1<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,unsigned_long,char>
                      (*(list<char,_std::allocator<char>_> **)this,__n >> 1,&local_29);
    *(list<char,_std::allocator<char>_> **)this = _Var1.container;
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
                  *)f,(back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *)this
                );
    __first.container = *(list<char,_std::allocator<char>_> **)this;
    __n = __n - (__n >> 1);
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      _Var1 = std::
              __fill_n_a1<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,unsigned_long,char>
                        (*(list<char,_std::allocator<char>_> **)this,__n,&local_29);
      *(list<char,_std::allocator<char>_> **)this = _Var1.container;
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
                    *)f,(back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *)
                        this);
      return;
    }
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
                  *)f,(back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *)this
                );
    __first.container = *(list<char,_std::allocator<char>_> **)this;
  }
  _Var1 = std::
          __fill_n_a1<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,unsigned_long,char>
                    (__first,__n,&local_29);
  *(list<char,_std::allocator<char>_> **)this = _Var1.container;
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }